

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  size_t sVar4;
  ulong local_60;
  size_t i_2;
  long use_success_count;
  long set_success_count;
  size_t total_alloc;
  bool one_set_successed;
  void *ret;
  size_t i_1;
  size_t check_fail_count;
  size_t i;
  uint local_10;
  undefined4 local_c;
  uint seed;
  
  local_c = 0;
  plan(5);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  quota_init(&quota,0);
  tVar2 = time((time_t *)0x0);
  local_10 = (uint)tVar2;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",(ulong)local_10);
  i._4_4_ = fprintf(_stdout,"\n");
  srand(local_10);
  for (check_fail_count = 0; check_fail_count < 10; check_fail_count = check_fail_count + 1) {
    pthread_create(threads + check_fail_count,(pthread_attr_t *)0x0,thread_routine,
                   datum + check_fail_count);
  }
  i_1 = 0;
  for (ret = (void *)0x0; ret < (void *)0xa; ret = (void *)((long)ret + 1)) {
    iVar1 = pthread_join(threads[(long)ret],(void **)&stack0xffffffffffffffc8);
    i_1 = (long)iVar1 + i_1;
  }
  total_alloc._7_1_ = 0;
  set_success_count = 0;
  use_success_count = 0;
  i_2 = 0;
  for (local_60 = 0; local_60 < 10; local_60 = local_60 + 1) {
    sVar4 = datum[local_60].last_lim_set;
    sVar3 = quota_total(&quota);
    if (sVar4 == sVar3) {
      total_alloc._7_1_ = 1;
    }
    set_success_count = datum[local_60].use_change + set_success_count;
    i_2 = datum[local_60].use_change_success + i_2;
    use_success_count = datum[local_60].lim_change_success + use_success_count;
  }
  _ok((uint)(i_1 == 0),"check_fail_count == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x5e,
      "no fails detected");
  _ok((uint)total_alloc._7_1_,"one_set_successed",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x5f,
      "one of thread limit set is final");
  sVar4 = quota_used(&quota);
  _ok((uint)(set_success_count == sVar4),"total_alloc == quota_used(&quota)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x60,
      "total alloc match");
  _ok((uint)(131072.0 < (double)(long)i_2),"use_success_count > THREAD_CNT * RUN_CNT * .1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x61,
      "uses are mosly successful");
  _ok((uint)(131072.0 < (double)use_success_count),"set_success_count > THREAD_CNT * RUN_CNT * .1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/quota.cc",0x62,
      "sets are mosly successful");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main()
{
	plan(5);
	header();

	quota_init(&quota, 0);
	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

	for (size_t i = 0; i < THREAD_CNT; i++) {
		pthread_create(threads + i, 0, thread_routine, (void *)(datum + i));
	}

	size_t check_fail_count = 0;
	for (size_t i = 0; i < THREAD_CNT; i++) {
		void *ret;
		check_fail_count += (size_t)pthread_join(threads[i], &ret);
	}

	bool one_set_successed = false;
	size_t total_alloc = 0;
	long set_success_count = 0;
	long use_success_count = 0;
	for (size_t i = 0; i < THREAD_CNT; i++) {
		if (datum[i].last_lim_set == quota_total(&quota))
			one_set_successed = true;
		total_alloc += datum[i].use_change;
		use_success_count += datum[i].use_change_success;
		set_success_count += datum[i].lim_change_success;
	}

	ok(check_fail_count == 0, "no fails detected");
	ok(one_set_successed, "one of thread limit set is final");
	ok(total_alloc == quota_used(&quota), "total alloc match");
	ok(use_success_count > THREAD_CNT * RUN_CNT * .1, "uses are mosly successful");
	ok(set_success_count > THREAD_CNT * RUN_CNT * .1, "sets are mosly successful");

	footer();
	return check_plan();
}